

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void deqp::gles3::Performance::anon_unknown_1::generateTwoPassRandomIterationOrder
               (vector<int,_std::allocator<int>_> *iterationOrder,int numSamples)

{
  int iVar1;
  undefined1 auVar2 [16];
  deUint32 dVar3;
  ulong uVar4;
  long lVar5;
  pointer piVar6;
  int iVar7;
  long lVar8;
  pointer piVar9;
  int sampleNdx;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Random rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,0xabc);
  auVar2 = _DAT_019f5ce0;
  iVar1 = numSamples + 1;
  uVar10 = (numSamples - (iVar1 >> 0x1f)) + 1 >> 1;
  piVar6 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < iVar1) {
    uVar4 = (ulong)(uVar10 + 1 & 0x7ffffffe);
    lVar5 = (ulong)uVar10 - 1;
    auVar11._8_4_ = (int)lVar5;
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar11 = auVar11 ^ _DAT_019f5ce0;
    auVar12 = _DAT_019fcc00;
    do {
      auVar14 = auVar12 ^ auVar2;
      if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                  auVar11._4_4_ < auVar14._4_4_) & 1)) {
        *(int *)((long)piVar6 + lVar5 * 2) = (int)lVar5;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        *(int *)((long)piVar6 + lVar5 * 2 + 4) = (int)lVar5 + 2;
      }
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 4;
      uVar4 = uVar4 - 2;
    } while (uVar4 != 0);
  }
  auVar12 = _DAT_019fcc00;
  auVar2 = _DAT_019f5ce0;
  if ((int)uVar10 < numSamples) {
    lVar5 = (long)(int)uVar10;
    lVar8 = (numSamples - lVar5) + -1;
    auVar14._8_4_ = (int)lVar8;
    auVar14._0_8_ = lVar8;
    auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
    iVar7 = 1;
    uVar4 = 0;
    auVar14 = auVar14 ^ _DAT_019f5ce0;
    do {
      auVar13._8_4_ = (int)uVar4;
      auVar13._0_8_ = uVar4;
      auVar13._12_4_ = (int)(uVar4 >> 0x20);
      auVar11 = (auVar13 | auVar12) ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar11._0_4_ ||
                  auVar14._4_4_ < auVar11._4_4_) & 1)) {
        piVar6[lVar5 + uVar4] = iVar7;
      }
      if ((auVar11._12_4_ != auVar14._12_4_ || auVar11._8_4_ <= auVar14._8_4_) &&
          auVar11._12_4_ <= auVar14._12_4_) {
        piVar6[lVar5 + uVar4 + 1] = iVar7 + 2;
      }
      uVar4 = uVar4 + 2;
      iVar7 = iVar7 + 4;
    } while (((numSamples - lVar5) + 1U & 0xfffffffffffffffe) != uVar4);
  }
  if (1 < iVar1) {
    uVar4 = 0;
    piVar9 = piVar6;
    do {
      dVar3 = deRandom_getUint32(&local_40);
      piVar6 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar9[uVar4];
      piVar9[uVar4] = piVar6[(ulong)dVar3 % (ulong)uVar10];
      piVar6[(ulong)dVar3 % (ulong)uVar10] = iVar1;
      uVar4 = uVar4 + 1;
      piVar9 = piVar6;
    } while (uVar10 != uVar4);
  }
  uVar4 = (ulong)((long)(iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar6) >> 2;
  if ((int)uVar10 < (int)uVar4) {
    lVar5 = (long)(int)uVar10;
    do {
      dVar3 = deRandom_getUint32(&local_40);
      iVar7 = dVar3 % ((int)uVar4 - uVar10) + uVar10;
      piVar9 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar6[lVar5];
      piVar6[lVar5] = piVar9[iVar7];
      piVar9[iVar7] = iVar1;
      lVar5 = lVar5 + 1;
      uVar4 = (ulong)((long)(iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar9) >> 2;
      piVar6 = piVar9;
    } while (lVar5 < (int)uVar4);
  }
  return;
}

Assistant:

static void generateTwoPassRandomIterationOrder (std::vector<int>& iterationOrder, int numSamples)
{
	de::Random	rnd			(0xabc);
	const int	midPoint	= (numSamples+1) / 2;		// !< ceil(m_numSamples / 2)

	DE_ASSERT((int)iterationOrder.size() == numSamples);

	// Two "passes" over range, randomize order in both passes
	// This allows to us detect if iterations are not independent
	// (first run and later run samples differ significantly?)

	for (int sampleNdx = 0; sampleNdx < midPoint; ++sampleNdx)
		iterationOrder[sampleNdx] = sampleNdx * 2;
	for (int sampleNdx = midPoint; sampleNdx < numSamples; ++sampleNdx)
		iterationOrder[sampleNdx] = (sampleNdx - midPoint) * 2 + 1;

	for (int ndx = 0; ndx < midPoint; ++ndx)
		std::swap(iterationOrder[ndx], iterationOrder[rnd.getInt(0, midPoint - 1)]);
	for (int ndx = midPoint; ndx < (int)iterationOrder.size(); ++ndx)
		std::swap(iterationOrder[ndx], iterationOrder[rnd.getInt(midPoint, (int)iterationOrder.size()-1)]);
}